

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O1

stmm_table *
stmm_init_table_with_params
          (stmm_compare_func_type compare,stmm_hash_func_type hash,int size,int density,
          double grow_factor,int reorder_flag)

{
  stmm_table *__ptr;
  stmm_table_entry **__s;
  Extra_MmFixed_t *pEVar1;
  ulong uVar2;
  
  __ptr = (stmm_table *)malloc(0x38);
  if (__ptr != (stmm_table *)0x0) {
    __ptr->compare = compare;
    __ptr->hash = hash;
    __ptr->num_entries = 0;
    __ptr->max_density = density;
    __ptr->grow_factor = grow_factor;
    __ptr->reorder_flag = reorder_flag;
    uVar2 = 1;
    if (1 < size) {
      uVar2 = (ulong)(uint)size;
    }
    __ptr->num_bins = (int)uVar2;
    __s = (stmm_table_entry **)malloc(uVar2 << 3);
    __ptr->bins = __s;
    if (__s != (stmm_table_entry **)0x0) {
      uVar2 = 1;
      if (1 < size) {
        uVar2 = (ulong)(uint)size;
      }
      memset(__s,0,uVar2 << 3);
      pEVar1 = Extra_MmFixedStart(0x18);
      __ptr->pMemMan = pEVar1;
      return __ptr;
    }
    free(__ptr);
  }
  return (stmm_table *)0x0;
}

Assistant:

stmm_table *
stmm_init_table_with_params (stmm_compare_func_type compare, stmm_hash_func_type hash, int size, int density, double grow_factor, int reorder_flag)
{
    int i;
    stmm_table *newTable;

    newTable = ABC_ALLOC(stmm_table, 1);
    if (newTable == NULL) {
    return NULL;
    }
    newTable->compare = compare;
    newTable->hash = hash;
    newTable->num_entries = 0;
    newTable->max_density = density;
    newTable->grow_factor = grow_factor;
    newTable->reorder_flag = reorder_flag;
    if (size <= 0) {
    size = 1;
    }
    newTable->num_bins = size;
    newTable->bins = ABC_ALLOC(stmm_table_entry *, size);
    if (newTable->bins == NULL) {
    ABC_FREE(newTable);
    return NULL;
    }
    for (i = 0; i < size; i++) {
    newTable->bins[i] = 0;
    }

    // added by alanmi
    newTable->pMemMan = Extra_MmFixedStart(sizeof (stmm_table_entry));
    return newTable;
}